

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O1

void deqp::gls::Functional::anon_unknown_0::drawPrimitives
               (Functions *gl,deUint32 program,deUint32 type,
               vector<float,_std::allocator<float>_> *vertices,
               vector<unsigned_short,_std::allocator<unsigned_short>_> *indices)

{
  pointer puVar1;
  GLuint GVar2;
  TestError *this;
  
  GVar2 = (*gl->getAttribLocation)(program,"a_position");
  if (-1 < (int)GVar2) {
    (*gl->useProgram)(program);
    (*gl->enableVertexAttribArray)(GVar2);
    (*gl->vertexAttribPointer)
              (GVar2,4,0x1406,'\0',0,
               (vertices->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start);
    puVar1 = (indices->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (*gl->drawElements)(type,(GLsizei)((ulong)((long)(indices->
                                                                                                          
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                              (long)puVar1) >> 1),0x1403,puVar1);
    (*gl->disableVertexAttribArray)(GVar2);
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"posLoc >= 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
             ,0x66);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void drawPrimitives (const glw::Functions& gl, deUint32 program, const deUint32 type, const vector<float>& vertices, const vector<deUint16>& indices)
{
	const deInt32 posLoc = gl.getAttribLocation(program, "a_position");

	TCU_CHECK(posLoc >= 0);

	gl.useProgram(program);
	gl.enableVertexAttribArray(posLoc);
	gl.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &vertices[0]);

	gl.drawElements(type, GLsizei(indices.size()), GL_UNSIGNED_SHORT, &indices[0]);

	gl.disableVertexAttribArray(posLoc);
}